

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

void __thiscall lan::db::print(db *this,size_t tabs,db_bit *bits)

{
  db_bit_type dVar1;
  size_t sVar2;
  char *__format;
  
  if (bits == (db_bit *)0x0) {
    bits = this->first;
  }
  for (; sVar2 = tabs, bits != (db_bit *)0x0; bits = bits->nex) {
    while (sVar2 != 0) {
      putchar(9);
      sVar2 = sVar2 - 1;
    }
    dVar1 = bits->type;
    if ((int)dVar1 < 9) {
      printf("| %s %d 0x%llx\n",(bits->key)._M_dataplus._M_p,(ulong)dVar1,bits->data);
    }
    else {
      __format = "( %s ):\n";
      if (dVar1 == Array) {
        __format = "[ %s ]:\n";
      }
      printf(__format,(bits->key)._M_dataplus._M_p);
      if (bits->lin != (db_bit *)0x0) {
        print(this,tabs + 1,bits->lin);
      }
    }
  }
  return;
}

Assistant:

void db::print(size_t tabs, lan::db_bit * bits){
            lan::db_bit * buffer = (bits) ? bits : first;
            while (buffer) {
                for(register_t i=0;i<tabs;i++)printf("\t");
                if(buffer->type < Array){
                    printf("| %s %d 0x%llx\n", buffer->key.data(), buffer->type, (long long)buffer->data);
                } else {
                    if(buffer->type == Array)
                        printf("[ %s ]:\n", buffer->key.data());
                    else printf("( %s ):\n", buffer->key.data());
                    if(buffer->lin)print(tabs+1, buffer->lin);
                } buffer = buffer->nex;
            }
        }